

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O2

void Abc_NtkMiterPrepare(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,Abc_Ntk_t *pNtkMiter,int fComb,
                        int nPartSize,int fMulti)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  int iVar5;
  
  pAVar1 = Abc_AigConst1(pNtkMiter);
  pAVar2 = Abc_AigConst1(pNtk1);
  (pAVar2->field_6).pCopy = pAVar1;
  pAVar1 = Abc_AigConst1(pNtkMiter);
  pAVar2 = Abc_AigConst1(pNtk2);
  (pAVar2->field_6).pCopy = pAVar1;
  if (fComb == 0) {
    for (iVar5 = 0; iVar5 < pNtk1->vPis->nSize; iVar5 = iVar5 + 1) {
      pAVar1 = Abc_NtkPi(pNtk1,iVar5);
      pAVar2 = Abc_NtkCreatePi(pNtkMiter);
      (pAVar1->field_6).pCopy = pAVar2;
      pAVar1 = Abc_NtkPi(pNtk2,iVar5);
      (pAVar1->field_6).pCopy = pAVar2;
      pcVar3 = Abc_ObjName(pAVar1);
      Abc_ObjAssignName(pAVar2,pcVar3,(char *)0x0);
    }
    if (nPartSize < 1) {
      if (fMulti == 0) {
        pAVar1 = Abc_NtkCreatePo(pNtkMiter);
        Abc_ObjAssignName(pAVar1,"miter",(char *)0x0);
      }
      else {
        for (iVar5 = 0; iVar5 < pNtk1->vPos->nSize; iVar5 = iVar5 + 1) {
          Abc_NtkPo(pNtk1,iVar5);
          pAVar1 = Abc_NtkCreatePo(pNtkMiter);
          pcVar3 = Abc_ObjName(pAVar1);
          Abc_ObjAssignName(pAVar1,"miter",pcVar3);
        }
      }
    }
    for (iVar5 = 0; iVar5 < pNtk1->vBoxes->nSize; iVar5 = iVar5 + 1) {
      pAVar1 = Abc_NtkBox(pNtk1,iVar5);
      if ((*(uint *)&pAVar1->field_0x14 & 0xf) == 8) {
        pAVar4 = Abc_NtkDupBox(pNtkMiter,pAVar1,0);
        pcVar3 = Abc_ObjName(pAVar1);
        Abc_ObjAssignName(pAVar4,pcVar3,"_1");
        pAVar2 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray];
        pcVar3 = Abc_ObjName((Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray]);
        Abc_ObjAssignName(pAVar2,pcVar3,"_1");
        pAVar2 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanouts).pArray];
        pcVar3 = Abc_ObjName((Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanouts).pArray]);
        Abc_ObjAssignName(pAVar2,pcVar3,"_1");
      }
    }
    for (iVar5 = 0; iVar5 < pNtk2->vBoxes->nSize; iVar5 = iVar5 + 1) {
      pAVar1 = Abc_NtkBox(pNtk2,iVar5);
      if ((*(uint *)&pAVar1->field_0x14 & 0xf) == 8) {
        pAVar4 = Abc_NtkDupBox(pNtkMiter,pAVar1,0);
        pcVar3 = Abc_ObjName(pAVar1);
        Abc_ObjAssignName(pAVar4,pcVar3,"_2");
        pAVar2 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray];
        pcVar3 = Abc_ObjName((Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray]);
        Abc_ObjAssignName(pAVar2,pcVar3,"_2");
        pAVar2 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanouts).pArray];
        pcVar3 = Abc_ObjName((Abc_Obj_t *)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanouts).pArray]);
        Abc_ObjAssignName(pAVar2,pcVar3,"_2");
      }
    }
  }
  else {
    for (iVar5 = 0; iVar5 < pNtk1->vCis->nSize; iVar5 = iVar5 + 1) {
      pAVar1 = Abc_NtkCi(pNtk1,iVar5);
      pAVar2 = Abc_NtkCreatePi(pNtkMiter);
      (pAVar1->field_6).pCopy = pAVar2;
      pAVar1 = Abc_NtkCi(pNtk2,iVar5);
      (pAVar1->field_6).pCopy = pAVar2;
      pcVar3 = Abc_ObjName(pAVar1);
      Abc_ObjAssignName(pAVar2,pcVar3,(char *)0x0);
    }
    if (nPartSize < 1) {
      if (fMulti == 0) {
        pAVar1 = Abc_NtkCreatePo(pNtkMiter);
        Abc_ObjAssignName(pAVar1,"miter",(char *)0x0);
        return;
      }
      for (iVar5 = 0; iVar5 < pNtk1->vCos->nSize; iVar5 = iVar5 + 1) {
        Abc_NtkCo(pNtk1,iVar5);
        pAVar1 = Abc_NtkCreatePo(pNtkMiter);
        pcVar3 = Abc_ObjName(pAVar1);
        Abc_ObjAssignName(pAVar1,"miter",pcVar3);
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkMiterPrepare( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Abc_Ntk_t * pNtkMiter, int fComb, int nPartSize, int fMulti )
{
    Abc_Obj_t * pObj, * pObjNew;
    int i;
    // clean the copy field in all objects
//    Abc_NtkCleanCopy( pNtk1 );
//    Abc_NtkCleanCopy( pNtk2 );
    Abc_AigConst1(pNtk1)->pCopy = Abc_AigConst1(pNtkMiter);
    Abc_AigConst1(pNtk2)->pCopy = Abc_AigConst1(pNtkMiter);

    if ( fComb )
    {
        // create new PIs and remember them in the old PIs
        Abc_NtkForEachCi( pNtk1, pObj, i )
        {
            pObjNew = Abc_NtkCreatePi( pNtkMiter );
            // remember this PI in the old PIs
            pObj->pCopy = pObjNew;
            pObj = Abc_NtkCi(pNtk2, i);  
            pObj->pCopy = pObjNew;
            // add name
            Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), NULL );
        }
        if ( nPartSize <= 0 )
        {
            // create POs
            if ( fMulti )
            {
                Abc_NtkForEachCo( pNtk1, pObj, i )
                {
                    pObjNew = Abc_NtkCreatePo( pNtkMiter );
                    Abc_ObjAssignName( pObjNew, "miter", Abc_ObjName(pObjNew) );
                }

            }
            else
            {
                pObjNew = Abc_NtkCreatePo( pNtkMiter );
                Abc_ObjAssignName( pObjNew, "miter", NULL );
            }
        }
    }
    else
    {
        // create new PIs and remember them in the old PIs
        Abc_NtkForEachPi( pNtk1, pObj, i )
        {
            pObjNew = Abc_NtkCreatePi( pNtkMiter );
            // remember this PI in the old PIs
            pObj->pCopy = pObjNew;
            pObj = Abc_NtkPi(pNtk2, i);  
            pObj->pCopy = pObjNew;
            // add name
            Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), NULL );
        }
        if ( nPartSize <= 0 )
        {
            // create POs
            if ( fMulti )
            {
                Abc_NtkForEachPo( pNtk1, pObj, i )
                {
                    pObjNew = Abc_NtkCreatePo( pNtkMiter );
                    Abc_ObjAssignName( pObjNew, "miter", Abc_ObjName(pObjNew) );
                }

            }
            else
            {
                pObjNew = Abc_NtkCreatePo( pNtkMiter );
                Abc_ObjAssignName( pObjNew, "miter", NULL );
            }
        }
        // create the latches
        Abc_NtkForEachLatch( pNtk1, pObj, i )
        {
            pObjNew = Abc_NtkDupBox( pNtkMiter, pObj, 0 );
            // add names
            Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), "_1" );
            Abc_ObjAssignName( Abc_ObjFanin0(pObjNew),  Abc_ObjName(Abc_ObjFanin0(pObj)), "_1" );
            Abc_ObjAssignName( Abc_ObjFanout0(pObjNew), Abc_ObjName(Abc_ObjFanout0(pObj)), "_1" );
        }
        Abc_NtkForEachLatch( pNtk2, pObj, i )
        {
            pObjNew = Abc_NtkDupBox( pNtkMiter, pObj, 0 );
            // add name
            Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), "_2" );
            Abc_ObjAssignName( Abc_ObjFanin0(pObjNew),  Abc_ObjName(Abc_ObjFanin0(pObj)), "_2" );
            Abc_ObjAssignName( Abc_ObjFanout0(pObjNew), Abc_ObjName(Abc_ObjFanout0(pObj)), "_2" );
        }
    }
}